

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_expression.cpp
# Opt level: O3

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::BoundParameterExpression::Deserialize
          (BoundParameterExpression *this,Deserializer *deserializer)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  BoundParameterExpression *this_00;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>
  *global_parameter_set;
  element_type *peVar2;
  type ret;
  LogicalType return_type;
  element_type *local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  size_type local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  string local_a0;
  LogicalType local_80;
  shared_ptr<duckdb::BoundParameterData,_true> local_68;
  element_type *local_58;
  element_type *local_50;
  LogicalType local_48;
  
  iVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"identifier");
  if ((char)iVar1 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    local_c0 = &local_b0;
    local_b0._M_local_buf[0] = '\0';
    local_b8 = 0;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_c0,deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  (*deserializer->_vptr_Deserializer[2])(deserializer,0xc9,"return_type");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  LogicalType::Deserialize(&local_80,deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  iVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xca,"parameter_data");
  if ((char)iVar1 == '\0') {
    peVar2 = (element_type *)0x0;
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    local_d0 = (element_type *)0x0;
  }
  else {
    iVar1 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar1 == '\0') {
      peVar2 = (element_type *)0x0;
      local_d0 = (element_type *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      BoundParameterData::Deserialize((BoundParameterData *)&local_58,deserializer);
      local_d0 = local_50;
      (*deserializer->_vptr_Deserializer[7])(deserializer);
      peVar2 = local_58;
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  this_00 = (BoundParameterExpression *)operator_new(0x88);
  global_parameter_set =
       Deserializer::
       Get<std::unordered_map<std::__cxx11::string,duckdb::shared_ptr<duckdb::BoundParameterData,true>,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality,std::allocator<std::pair<std::__cxx11::string_const,duckdb::shared_ptr<duckdb::BoundParameterData,true>>>>&>
                 (deserializer);
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  if (local_c0 == &local_b0) {
    local_a0.field_2._8_8_ = local_b0._8_8_;
  }
  else {
    local_a0._M_dataplus._M_p = (pointer)local_c0;
  }
  local_a0.field_2._M_allocated_capacity._1_7_ = local_b0._M_allocated_capacity._1_7_;
  local_a0.field_2._M_local_buf[0] = local_b0._M_local_buf[0];
  local_a0._M_string_length = local_b8;
  local_b8 = 0;
  local_b0._M_local_buf[0] = '\0';
  local_c0 = &local_b0;
  LogicalType::LogicalType(&local_48,&local_80);
  local_68.internal.super___shared_ptr<duckdb::BoundParameterData,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0;
  local_68.internal.super___shared_ptr<duckdb::BoundParameterData,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar2;
  BoundParameterExpression(this_00,global_parameter_set,&local_a0,&local_48,&local_68);
  if ((element_type *)
      local_68.internal.super___shared_ptr<duckdb::BoundParameterData,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (element_type *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.internal.
               super___shared_ptr<duckdb::BoundParameterData,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  LogicalType::~LogicalType(&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  (this->super_Expression).super_BaseExpression._vptr_BaseExpression = (_func_int **)this_00;
  LogicalType::~LogicalType(&local_80);
  if (local_c0 != &local_b0) {
    operator_delete(local_c0);
  }
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> BoundParameterExpression::Deserialize(Deserializer &deserializer) {
	auto identifier = deserializer.ReadPropertyWithDefault<string>(200, "identifier");
	auto return_type = deserializer.ReadProperty<LogicalType>(201, "return_type");
	auto parameter_data = deserializer.ReadPropertyWithDefault<shared_ptr<BoundParameterData>>(202, "parameter_data");
	auto result = duckdb::unique_ptr<BoundParameterExpression>(new BoundParameterExpression(deserializer.Get<bound_parameter_map_t &>(), std::move(identifier), std::move(return_type), std::move(parameter_data)));
	return std::move(result);
}